

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

Field_element __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>
::get_pivot_value(Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>
                  *this)

{
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
  *this_00;
  bool bVar1;
  ID_index IVar2;
  uint uVar3;
  ID_index IVar4;
  reference ppEVar5;
  uint *puVar6;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range4;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>
  *this_local;
  
  IVar2 = Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
          ::get_pivot(&this->super_Chain_column_option);
  uVar3 = Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>
          ::get_null_value<unsigned_int>();
  if (IVar2 != uVar3) {
    boost::container::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
    ::begin((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
             *)&__end0);
    boost::container::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
    ::end((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
           *)&entry);
    while (bVar1 = boost::container::operator!=
                             (&__end0,(vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_**,_true>
                                       *)&entry), bVar1) {
      ppEVar5 = boost::container::
                vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_**,_true>
                ::operator*(&__end0);
      this_00 = *ppEVar5;
      IVar4 = Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
              ::get_row_index(this_00);
      IVar2 = Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
              ::get_pivot(&this->super_Chain_column_option);
      if (IVar4 == IVar2) {
        puVar6 = Entry_field_element<unsigned_int>::get_element
                           (&this_00->super_Entry_field_element_option);
        return *puVar6;
      }
      boost::container::
      vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_**,_true>
      ::operator++(&__end0);
    }
  }
  return 0;
}

Assistant:

inline typename Naive_vector_column<Master_matrix,Support>::Field_element Naive_vector_column<Master_matrix,Support>::get_pivot_value()
    const
{
  static_assert(Master_matrix::isNonBasic,
                "Method not available for base columns.");  // could technically be, but is the notion useful then?

  if constexpr (Master_matrix::Option_list::is_z2) {
    return 1;
  } else {
    if constexpr (Master_matrix::Option_list::is_of_boundary_type) {
      return column_.empty() ? Field_element() : column_.back()->get_element();
    } else {
      if (Chain_opt::get_pivot() == Master_matrix::template get_null_value<ID_index>()) return Field_element();
      for (const Entry* entry : column_) {
        if (entry->get_row_index() == Chain_opt::get_pivot()) return entry->get_element();
      }
      return Field_element();  // should never happen if chain column is used properly
    }
  }
}